

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O1

int4 __thiscall EmitXml::beginBlock(EmitXml *this,FlowBlock *bl)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  
  poVar3 = this->s;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<block ",7);
  pcVar1 = highlight[8];
  if (highlight[8] == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(highlight[8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," blockref=\"0x",0xd);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bl->index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">",2);
  return 0;
}

Assistant:

int4 EmitXml::beginBlock(const FlowBlock *bl) {
  *s << "<block " << highlight[(int4)no_color] << " blockref=\"0x" << hex <<
    bl->getIndex() << "\">";
  return 0;
}